

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvreader.cc
# Opt level: O2

void __thiscall mkvparser::MkvReader::~MkvReader(MkvReader *this)

{
  ~MkvReader(this);
  operator_delete(this);
  return;
}

Assistant:

MkvReader::~MkvReader() {
  if (reader_owns_file_)
    Close();
  m_file = NULL;
}